

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v128_intrinsics_c.h
# Opt level: O2

c_v128 c_v128_shr_s32(c_v128 a,uint c)

{
  c_v64 cVar1;
  c_v128 cVar2;
  
  cVar1 = c_v64_shr_s32(a.v64[1],c);
  cVar2._0_8_ = c_v64_shr_s32(a.v64[0],c);
  cVar2.v64[1] = (c_v64)(c_v64)cVar1.u64;
  return cVar2;
}

Assistant:

SIMD_INLINE c_v128 c_v128_shr_s32(c_v128 a, const unsigned int c) {
  return c_v128_from_v64(c_v64_shr_s32(a.v64[1], c),
                         c_v64_shr_s32(a.v64[0], c));
}